

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O2

int mk_iov_consume(mk_iov *mk_io,size_t bytes)

{
  long *plVar1;
  size_t sVar2;
  iovec *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar2 = mk_io->total_len;
  if (sVar2 == bytes) {
    mk_io->total_len = 0;
    mk_io->iov_idx = 0;
  }
  else {
    uVar5 = 0;
    uVar6 = (ulong)(uint)mk_io->iov_idx;
    if (mk_io->iov_idx < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
      piVar3 = mk_io->io;
      uVar4 = *(ulong *)((long)&piVar3->iov_len + uVar5);
      uVar7 = bytes;
      if (uVar4 != 0) {
        if (bytes < uVar4) {
          plVar1 = (long *)((long)&piVar3->iov_base + uVar5);
          *plVar1 = *plVar1 + bytes;
          *(ulong *)((long)&piVar3->iov_len + uVar5) = uVar4 - bytes;
          break;
        }
        *(undefined8 *)((long)&piVar3->iov_len + uVar5) = 0;
        uVar7 = bytes - uVar4;
        if (uVar7 == 0) break;
      }
      bytes = uVar7;
    }
    mk_io->total_len = sVar2 - bytes;
  }
  return 0;
}

Assistant:

int mk_iov_consume(struct mk_iov *mk_io, size_t bytes)
{
    int i;
    size_t len;

    if (mk_io->total_len == bytes) {
        mk_io->total_len = 0;
        mk_io->iov_idx   = 0;
        return 0;
    }

    for (i = 0; i < mk_io->iov_idx; i++) {
        len = mk_io->io[i].iov_len;
        if (len == 0) {
            continue;
        }

        if (bytes < len) {
            mk_io->io[i].iov_base = (uint8_t *)mk_io->io[i].iov_base + bytes;
            mk_io->io[i].iov_len   = (len - bytes);
            break;
        }
        else if (bytes == len) {
            /* this entry was consumed */
            mk_io->io[i].iov_len = 0;
            break;
        }
        else {
            /* bytes > 0, consume this entry */
            mk_io->io[i].iov_len = 0;
            bytes -= len;
        }
    }

    mk_io->total_len -= (unsigned long)bytes;
    return 0;
}